

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O0

char * __thiscall google::protobuf::FieldDescriptor::index(FieldDescriptor *this,char *__s,int __c)

{
  Descriptor *pDVar1;
  FieldDescriptor *this_local;
  
  if (((byte)this[0x50] & 1) == 0) {
    pDVar1 = containing_type(this);
    this_local._4_4_ = (uint)(((long)this - *(long *)(pDVar1 + 0x30)) / 0xa8);
  }
  else if (*(long *)(this + 0x68) == 0) {
    this_local._4_4_ = (uint)(((long)this - *(long *)(*(long *)(this + 0x30) + 0x98)) / 0xa8);
  }
  else {
    this_local._4_4_ = (uint)(((long)this - *(long *)(*(long *)(this + 0x68) + 0x80)) / 0xa8);
  }
  return (char *)(ulong)this_local._4_4_;
}

Assistant:

inline int FieldDescriptor::index() const {
  if (!is_extension_) {
    return static_cast<int>(this - containing_type()->fields_);
  } else if (extension_scope_ != NULL) {
    return static_cast<int>(this - extension_scope_->extensions_);
  } else {
    return static_cast<int>(this - file_->extensions_);
  }
}